

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O0

void __thiscall
t_ocaml_generator::generate_serialize_field
          (t_ocaml_generator *this,ostream *out,t_field *tfield,string *name)

{
  t_struct *ptVar1;
  t_field *ptVar2;
  uint uVar3;
  int iVar4;
  t_type *type_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  long lVar6;
  string *psVar7;
  undefined4 extraout_var;
  undefined8 uVar8;
  undefined8 uVar9;
  ostream *poVar10;
  undefined1 auVar11 [12];
  string local_130;
  undefined1 local_110 [8];
  string ename;
  string local_e8;
  t_base local_c4;
  undefined1 local_c0 [4];
  t_base tbase;
  string local_a0;
  string local_80;
  string local_60;
  t_struct *local_30;
  t_type *type;
  string *name_local;
  t_field *tfield_local;
  ostream *out_local;
  t_ocaml_generator *this_local;
  
  type = (t_type *)name;
  name_local = (string *)tfield;
  tfield_local = (t_field *)out;
  out_local = (ostream *)this;
  type_00 = t_field::get_type(tfield);
  local_30 = (t_struct *)t_generator::get_true_type(type_00);
  uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[4])();
  if ((uVar3 & 1) == 0) {
    lVar6 = std::__cxx11::string::length();
    if (lVar6 == 0) {
      psVar7 = t_field::get_name_abi_cxx11_((t_field *)name_local);
      std::__cxx11::string::string((string *)&local_80,(string *)psVar7);
      t_generator::decapitalize(&local_60,(t_generator *)this,&local_80);
      std::__cxx11::string::operator=((string *)name,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
    }
    uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[0xb])();
    if (((uVar3 & 1) == 0) &&
       (uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[0xc])(), (uVar3 & 1) == 0)) {
      uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[0xd])();
      ptVar2 = tfield_local;
      ptVar1 = local_30;
      if ((uVar3 & 1) == 0) {
        uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[5])();
        if (((uVar3 & 1) == 0) &&
           (uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[10])(), (uVar3 & 1) == 0)) {
          t_field::get_name_abi_cxx11_((t_field *)name_local);
          uVar8 = std::__cxx11::string::c_str();
          (*(local_30->super_t_type).super_t_doc._vptr_t_doc[3])();
          uVar9 = std::__cxx11::string::c_str();
          printf("DO NOT KNOW HOW TO SERIALIZE FIELD \'%s\' TYPE \'%s\'\n",uVar8,uVar9);
        }
        else {
          poVar10 = t_generator::indent((t_generator *)this,(ostream *)tfield_local);
          std::operator<<(poVar10,"oprot#");
          uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[5])();
          if ((uVar3 & 1) == 0) {
            uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[10])();
            if ((uVar3 & 1) != 0) {
              iVar4 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[3])();
              std::__cxx11::string::string
                        ((string *)&local_130,(string *)CONCAT44(extraout_var,iVar4));
              t_generator::capitalize((string *)local_110,(t_generator *)this,&local_130);
              std::__cxx11::string::~string((string *)&local_130);
              poVar10 = std::operator<<((ostream *)tfield_local,"writeI32(");
              poVar10 = std::operator<<(poVar10,(string *)local_110);
              poVar10 = std::operator<<(poVar10,".to_i ");
              poVar10 = std::operator<<(poVar10,(string *)name);
              std::operator<<(poVar10,")");
              std::__cxx11::string::~string((string *)local_110);
            }
          }
          else {
            local_c4 = t_base_type::get_base((t_base_type *)local_30);
            switch(local_c4) {
            case TYPE_VOID:
              pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __cxa_allocate_exception(0x20);
              std::operator+(pbVar5,"compiler error: cannot serialize void field in a struct: ",name
                            );
              __cxa_throw(pbVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            case TYPE_STRING:
              poVar10 = std::operator<<((ostream *)tfield_local,"writeString(");
              poVar10 = std::operator<<(poVar10,(string *)name);
              std::operator<<(poVar10,")");
              break;
            case TYPE_BOOL:
              poVar10 = std::operator<<((ostream *)tfield_local,"writeBool(");
              poVar10 = std::operator<<(poVar10,(string *)name);
              std::operator<<(poVar10,")");
              break;
            case TYPE_I8:
              poVar10 = std::operator<<((ostream *)tfield_local,"writeByte(");
              poVar10 = std::operator<<(poVar10,(string *)name);
              std::operator<<(poVar10,")");
              break;
            case TYPE_I16:
              poVar10 = std::operator<<((ostream *)tfield_local,"writeI16(");
              poVar10 = std::operator<<(poVar10,(string *)name);
              std::operator<<(poVar10,")");
              break;
            case TYPE_I32:
              poVar10 = std::operator<<((ostream *)tfield_local,"writeI32(");
              poVar10 = std::operator<<(poVar10,(string *)name);
              std::operator<<(poVar10,")");
              break;
            case TYPE_I64:
              poVar10 = std::operator<<((ostream *)tfield_local,"writeI64(");
              poVar10 = std::operator<<(poVar10,(string *)name);
              std::operator<<(poVar10,")");
              break;
            case TYPE_DOUBLE:
              poVar10 = std::operator<<((ostream *)tfield_local,"writeDouble(");
              poVar10 = std::operator<<(poVar10,(string *)name);
              std::operator<<(poVar10,")");
              break;
            default:
              ename.field_2._M_local_buf[0xf] = '\x01';
              auVar11 = __cxa_allocate_exception(0x20);
              t_base_type::t_base_name_abi_cxx11_
                        (&local_e8,(t_base_type *)(ulong)local_c4,auVar11._8_4_);
              std::operator+(auVar11._0_8_,"compiler error: no ocaml name for base type ",&local_e8)
              ;
              ename.field_2._M_local_buf[0xf] = '\0';
              __cxa_throw(auVar11._0_8_,&std::__cxx11::string::typeinfo,
                          std::__cxx11::string::~string);
            }
          }
        }
      }
      else {
        std::__cxx11::string::string((string *)local_c0,(string *)name);
        generate_serialize_container
                  (this,(ostream *)ptVar2,&ptVar1->super_t_type,(string *)local_c0);
        std::__cxx11::string::~string((string *)local_c0);
      }
    }
    else {
      ptVar2 = tfield_local;
      ptVar1 = local_30;
      std::__cxx11::string::string((string *)&local_a0,(string *)name);
      generate_serialize_struct(this,(ostream *)ptVar2,ptVar1,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    poVar10 = std::operator<<((ostream *)tfield_local,";");
    std::operator<<(poVar10,(string *)&::endl_abi_cxx11_);
    return;
  }
  pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
  psVar7 = t_field::get_name_abi_cxx11_((t_field *)name_local);
  std::operator+(pbVar5,"CANNOT GENERATE SERIALIZE CODE FOR void TYPE: ",psVar7);
  __cxa_throw(pbVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void t_ocaml_generator::generate_serialize_field(ostream& out, t_field* tfield, string name) {
  t_type* type = get_true_type(tfield->get_type());

  // Do nothing for void types
  if (type->is_void()) {
    throw "CANNOT GENERATE SERIALIZE CODE FOR void TYPE: " + tfield->get_name();
  }

  if (name.length() == 0) {
    name = decapitalize(tfield->get_name());
  }

  if (type->is_struct() || type->is_xception()) {
    generate_serialize_struct(out, (t_struct*)type, name);
  } else if (type->is_container()) {
    generate_serialize_container(out, type, name);
  } else if (type->is_base_type() || type->is_enum()) {

    indent(out) << "oprot#";

    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "compiler error: cannot serialize void field in a struct: " + name;
        break;
      case t_base_type::TYPE_STRING:
        out << "writeString(" << name << ")";
        break;
      case t_base_type::TYPE_BOOL:
        out << "writeBool(" << name << ")";
        break;
      case t_base_type::TYPE_I8:
        out << "writeByte(" << name << ")";
        break;
      case t_base_type::TYPE_I16:
        out << "writeI16(" << name << ")";
        break;
      case t_base_type::TYPE_I32:
        out << "writeI32(" << name << ")";
        break;
      case t_base_type::TYPE_I64:
        out << "writeI64(" << name << ")";
        break;
      case t_base_type::TYPE_DOUBLE:
        out << "writeDouble(" << name << ")";
        break;
      default:
        throw "compiler error: no ocaml name for base type " + t_base_type::t_base_name(tbase);
      }
    } else if (type->is_enum()) {
      string ename = capitalize(type->get_name());
      out << "writeI32(" << ename << ".to_i " << name << ")";
    }

  } else {
    printf("DO NOT KNOW HOW TO SERIALIZE FIELD '%s' TYPE '%s'\n",
           tfield->get_name().c_str(),
           type->get_name().c_str());
  }
  out << ";" << endl;
}